

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O2

void __thiscall sf::priv::GlxContext::~GlxContext(GlxContext *this)

{
  GLXContext p_Var1;
  GLXContext p_Var2;
  
  (this->super_GlContext)._vptr_GlContext = (_func_int **)&PTR__GlxContext_00164b68;
  GlContext::cleanupUnsharedResources(&this->super_GlContext);
  if (this->m_context != (GLXContext)0x0) {
    p_Var1 = (GLXContext)glXGetCurrentContext();
    p_Var2 = this->m_context;
    if (p_Var1 == p_Var2) {
      glXMakeCurrent(this->m_display,0,0);
      p_Var2 = this->m_context;
    }
    glXDestroyContext(this->m_display,p_Var2);
  }
  if (this->m_pbuffer != 0) {
    glXDestroyPbuffer(this->m_display);
  }
  if ((this->m_window != 0) && (this->m_ownsWindow == true)) {
    XDestroyWindow(this->m_display);
    XFlush(this->m_display);
  }
  CloseDisplay(this->m_display);
  GlContext::~GlContext(&this->super_GlContext);
  return;
}

Assistant:

GlxContext::~GlxContext()
{
    // Notify unshared OpenGL resources of context destruction
    cleanupUnsharedResources();

    // Destroy the context
    if (m_context)
    {
#if defined(GLX_DEBUGGING)
        GlxErrorHandler handler(m_display);
#endif

        if (glXGetCurrentContext() == m_context)
            glXMakeCurrent(m_display, None, NULL);
        glXDestroyContext(m_display, m_context);

#if defined(GLX_DEBUGGING)
        if (glxErrorOccurred)
            err() << "GLX error in GlxContext::~GlxContext()" << std::endl;
#endif
    }

    if (m_pbuffer)
    {
        glXDestroyPbuffer(m_display, m_pbuffer);
    }

    // Destroy the window if we own it
    if (m_window && m_ownsWindow)
    {
        XDestroyWindow(m_display, m_window);
        XFlush(m_display);
    }

    // Close the connection with the X server
    CloseDisplay(m_display);
}